

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv32_impl.h
# Opt level: O1

void secp256k1_modinv32_mul_30
               (secp256k1_modinv32_signed30 *r,secp256k1_modinv32_signed30 *a,int alen,
               int32_t factor)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  bool bVar34;
  bool bVar35;
  undefined1 auVar36 [16];
  int iVar37;
  uint uVar38;
  uint uVar39;
  undefined4 uVar40;
  uint extraout_EAX;
  secp256k1_modinv32_signed30 *psVar41;
  ulong uVar42;
  ulong uVar43;
  secp256k1_modinv32_signed30 *psVar44;
  long lVar45;
  uint uVar46;
  uint uVar47;
  int extraout_EDX;
  int extraout_EDX_00;
  uint *extraout_RDX;
  int32_t *piVar48;
  long lVar49;
  secp256k1_modinv32_signed30 *b;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  secp256k1_fe *psVar56;
  ulong uVar57;
  uint uVar58;
  uint uVar59;
  uint uVar60;
  secp256k1_fe *psVar61;
  ulong uVar62;
  secp256k1_fe *psVar63;
  secp256k1_fe *a_00;
  secp256k1_modinv32_signed30 *a_01;
  long lVar64;
  ulong uVar65;
  secp256k1_fe *r_00;
  secp256k1_fe *r_01;
  uint uVar66;
  uint uVar67;
  ulong uVar68;
  ulong uVar69;
  uint uVar70;
  long lVar71;
  ulong uVar72;
  ulong uVar73;
  ulong uVar74;
  ulong uVar75;
  ulong uVar76;
  ulong uVar77;
  ulong uVar78;
  long lVar79;
  uint uVar80;
  secp256k1_modinv32_signed30 *psVar81;
  code *pcVar82;
  uint uVar83;
  secp256k1_modinv32_signed30 *psVar84;
  uint uVar85;
  code *pcVar86;
  code *pcVar87;
  uint extraout_XMM0_Da;
  uint extraout_XMM0_Db;
  uint extraout_XMM0_Dc;
  undefined1 auVar88 [16];
  uint extraout_XMM0_Dd;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  uchar auStack_2a0 [40];
  secp256k1_fe *psStack_278;
  code *pcStack_270;
  ulong uStack_268;
  secp256k1_fe *psStack_260;
  code *pcStack_258;
  secp256k1_fe *psStack_250;
  code *pcStack_240;
  undefined1 auStack_238 [32];
  secp256k1_fe sStack_218;
  undefined1 auStack_1e8 [16];
  undefined1 auStack_1d0 [48];
  undefined8 uStack_1a0;
  secp256k1_fe *psStack_198;
  undefined8 uStack_190;
  code *pcStack_188;
  secp256k1_fe sStack_180;
  secp256k1_fe sStack_150;
  secp256k1_fe sStack_120;
  ulong uStack_e8;
  ulong uStack_e0;
  ulong uStack_d8;
  secp256k1_modinv32_signed30 *psStack_d0;
  ulong uStack_c8;
  code *pcStack_c0;
  uint uStack_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  uint uStack_a8;
  uint uStack_a4;
  secp256k1_modinv32_signed30 *psStack_a0;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  int32_t iStack_84;
  secp256k1_modinv32_signed30 *psStack_80;
  secp256k1_modinv32_signed30 *psStack_78;
  secp256k1_modinv32_signed30 *psStack_70;
  secp256k1_modinv32_signed30 *psStack_68;
  secp256k1_modinv32_signed30 *psStack_60;
  code *pcStack_58;
  long lStack_48;
  long lStack_40;
  
  lVar71 = 0;
  psVar41 = (secp256k1_modinv32_signed30 *)0x0;
  do {
    if (lVar71 < alen) {
      psVar41 = (secp256k1_modinv32_signed30 *)
                ((long)psVar41->v + (long)a->v[lVar71] * (long)factor);
    }
    r->v[lVar71] = (uint)psVar41 & 0x3fffffff;
    psVar41 = (secp256k1_modinv32_signed30 *)((long)psVar41 >> 0x1e);
    lVar71 = lVar71 + 1;
  } while (lVar71 != 8);
  if (8 < alen) {
    psVar41 = (secp256k1_modinv32_signed30 *)((long)psVar41->v + (long)a->v[8] * (long)factor);
  }
  psVar44 = (secp256k1_modinv32_signed30 *)(long)(int)psVar41;
  if (psVar44 == psVar41) {
    r->v[8] = (int)psVar41;
    return;
  }
  secp256k1_modinv32_mul_30_cold_1();
  uVar59 = *extraout_RDX;
  psVar84 = (secp256k1_modinv32_signed30 *)(long)(int)uVar59;
  uVar47 = extraout_RDX[1];
  lVar71 = (long)(int)uVar47;
  uVar60 = extraout_RDX[2];
  psVar41 = (secp256k1_modinv32_signed30 *)(long)(int)uVar60;
  lStack_48 = (long)(int)extraout_RDX[3];
  psVar61 = (secp256k1_fe *)0x9;
  pcStack_58 = (code *)0x15715a;
  a_01 = r;
  iVar37 = secp256k1_modinv32_mul_cmp_30(r,9,psVar44,-2);
  if (iVar37 < 1) {
    pcStack_58 = (code *)0x1573c2;
    secp256k1_modinv32_update_de_30_cold_12();
LAB_001573c2:
    pcStack_58 = (code *)0x1573c7;
    secp256k1_modinv32_update_de_30_cold_11();
LAB_001573c7:
    pcStack_58 = (code *)0x1573cc;
    secp256k1_modinv32_update_de_30_cold_10();
LAB_001573cc:
    pcStack_58 = (code *)0x1573d1;
    secp256k1_modinv32_update_de_30_cold_9();
LAB_001573d1:
    pcStack_58 = (code *)0x1573d6;
    secp256k1_modinv32_update_de_30_cold_8();
LAB_001573d6:
    pcStack_58 = (code *)0x1573db;
    secp256k1_modinv32_update_de_30_cold_7();
LAB_001573db:
    pcStack_58 = (code *)0x1573e0;
    secp256k1_modinv32_update_de_30_cold_1();
LAB_001573e0:
    pcStack_58 = (code *)0x1573e5;
    secp256k1_modinv32_update_de_30_cold_2();
    psVar81 = psVar44;
LAB_001573e5:
    pcStack_58 = (code *)0x1573ea;
    secp256k1_modinv32_update_de_30_cold_6();
LAB_001573ea:
    pcStack_58 = (code *)0x1573ef;
    secp256k1_modinv32_update_de_30_cold_5();
LAB_001573ef:
    pcStack_58 = (code *)0x1573f4;
    secp256k1_modinv32_update_de_30_cold_4();
  }
  else {
    psVar61 = (secp256k1_fe *)0x9;
    pcStack_58 = (code *)0x157177;
    a_01 = r;
    iVar37 = secp256k1_modinv32_mul_cmp_30(r,9,psVar44,1);
    if (-1 < iVar37) goto LAB_001573c2;
    psVar61 = (secp256k1_fe *)0x9;
    pcStack_58 = (code *)0x157194;
    a_01 = a;
    iVar37 = secp256k1_modinv32_mul_cmp_30(a,9,psVar44,-2);
    if (iVar37 < 1) goto LAB_001573c7;
    psVar61 = (secp256k1_fe *)0x9;
    pcStack_58 = (code *)0x1571b1;
    a_01 = a;
    iVar37 = secp256k1_modinv32_mul_cmp_30(a,9,psVar44,1);
    if (-1 < iVar37) goto LAB_001573cc;
    psVar81 = (secp256k1_modinv32_signed30 *)-(long)psVar84;
    if (0 < (long)psVar84) {
      psVar81 = psVar84;
    }
    lVar45 = -lVar71;
    if (lVar71 < 1) {
      lVar45 = lVar71;
    }
    if (lVar45 + 0x40000000 < (long)psVar81) goto LAB_001573d1;
    psVar81 = (secp256k1_modinv32_signed30 *)-(long)psVar41;
    if (0 < (long)psVar41) {
      psVar81 = psVar41;
    }
    lVar45 = -lStack_48;
    if (lStack_48 < 1) {
      lVar45 = lStack_48;
    }
    if (lVar45 + 0x40000000 < (long)psVar81) goto LAB_001573d6;
    uVar66 = r->v[8] >> 0x1f;
    uVar58 = a->v[8] >> 0x1f;
    psVar61 = (secp256k1_fe *)(ulong)uVar58;
    iVar37 = (uVar58 & uVar47) + (uVar66 & uVar59);
    a_01 = (secp256k1_modinv32_signed30 *)(a->v[0] * lVar71 + (long)r->v[0] * (long)psVar84);
    lVar45 = (long)(int)(iVar37 - ((int)a_01 * psVar44[1].v[0] + iVar37 & 0x3fffffffU));
    piVar48 = (int32_t *)((long)a_01->v + lVar45 * psVar44->v[0]);
    if (((ulong)piVar48 & 0x3fffffff) != 0) goto LAB_001573db;
    iVar37 = (uVar58 & (uint)lStack_48) + (uVar66 & uVar60);
    lVar79 = a->v[0] * lStack_48 + (long)r->v[0] * (long)psVar41;
    a_01 = (secp256k1_modinv32_signed30 *)0x3fffffff;
    uVar59 = iVar37 - (psVar44[1].v[0] * (int)lVar79 + iVar37 & 0x3fffffffU);
    psVar61 = (secp256k1_fe *)(ulong)uVar59;
    uVar42 = (long)psVar44->v[0] * (long)(int)uVar59 + lVar79;
    lStack_40 = lVar45;
    if ((uVar42 & 0x3fffffff) != 0) goto LAB_001573e0;
    lVar79 = (long)uVar42 >> 0x1e;
    lVar49 = (long)piVar48 >> 0x1e;
    lVar64 = 1;
    do {
      lVar49 = psVar44->v[lVar64] * lVar45 + a->v[lVar64] * lVar71 +
               (long)r->v[lVar64] * (long)psVar84 + lVar49;
      psVar81 = (secp256k1_modinv32_signed30 *)(a->v[lVar64] * lStack_48);
      lVar79 = (long)psVar81->v +
               (long)r->v[lVar64] * (long)psVar41 + lVar79 +
               (long)psVar44->v[lVar64] * (long)(int)uVar59;
      r->v[lVar64 + -1] = (uint)lVar49 & 0x3fffffff;
      a->v[lVar64 + -1] = (uint)lVar79 & 0x3fffffff;
      lVar64 = lVar64 + 1;
      lVar79 = lVar79 >> 0x1e;
      lVar49 = lVar49 >> 0x1e;
    } while (lVar64 != 9);
    r->v[8] = (int32_t)lVar49;
    a->v[8] = (int32_t)lVar79;
    psVar61 = (secp256k1_fe *)0x9;
    pcStack_58 = (code *)0x15735b;
    a_01 = r;
    iVar37 = secp256k1_modinv32_mul_cmp_30(r,9,psVar44,-2);
    psVar41 = a;
    psVar84 = psVar44;
    if (iVar37 < 1) goto LAB_001573e5;
    psVar61 = (secp256k1_fe *)0x9;
    pcStack_58 = (code *)0x157378;
    a_01 = r;
    iVar37 = secp256k1_modinv32_mul_cmp_30(r,9,psVar44,1);
    if (-1 < iVar37) goto LAB_001573ea;
    psVar61 = (secp256k1_fe *)0x9;
    pcStack_58 = (code *)0x157391;
    a_01 = a;
    iVar37 = secp256k1_modinv32_mul_cmp_30(a,9,psVar44,-2);
    if (iVar37 < 1) goto LAB_001573ef;
    psVar61 = (secp256k1_fe *)0x9;
    pcStack_58 = (code *)0x1573aa;
    a_01 = a;
    iVar37 = secp256k1_modinv32_mul_cmp_30(a,9,psVar44,1);
    if (iVar37 < 0) {
      return;
    }
  }
  pcStack_58 = secp256k1_modinv32_normalize_30;
  secp256k1_modinv32_update_de_30_cold_3();
  uVar59 = a_01->v[0];
  uVar62 = (ulong)uVar59;
  uVar47 = a_01->v[3];
  uVar50 = (ulong)uVar47;
  uVar60 = a_01->v[4];
  uVar43 = (ulong)uVar60;
  uVar58 = a_01->v[5];
  uVar57 = (ulong)uVar58;
  psVar44 = (secp256k1_modinv32_signed30 *)(ulong)(uint)a_01->v[6];
  uVar66 = a_01->v[7];
  uVar42 = (ulong)uVar66;
  iStack_84 = a_01->v[8];
  lVar45 = 0;
  do {
    psStack_80 = psVar41;
    psStack_78 = psVar81;
    psStack_70 = psVar84;
    psStack_68 = a;
    psStack_60 = r;
    pcStack_58 = (code *)lVar71;
    if (a_01->v[lVar45] < -0x3fffffff) {
      pcStack_c0 = (code *)0x157742;
      secp256k1_modinv32_normalize_30_cold_7();
LAB_00157742:
      pcStack_c0 = (code *)0x157747;
      secp256k1_modinv32_normalize_30_cold_6();
      goto LAB_00157747;
    }
    if (0x3fffffff < a_01->v[lVar45]) goto LAB_00157742;
    lVar45 = lVar45 + 1;
  } while (lVar45 != 9);
  uStack_a4 = (uint)psVar61;
  psVar61 = (secp256k1_fe *)0x9;
  pcStack_c0 = (code *)0x15747f;
  psVar44 = a_01;
  uStack_b0 = a_01->v[1];
  uStack_ac = a_01->v[2];
  uStack_a8 = a_01->v[6];
  psStack_a0 = b;
  iVar37 = secp256k1_modinv32_mul_cmp_30(a_01,9,b,-2);
  if (iVar37 < 1) {
LAB_00157747:
    pcStack_c0 = (code *)0x15774c;
    secp256k1_modinv32_normalize_30_cold_5();
LAB_0015774c:
    pcStack_c0 = (code *)0x157751;
    secp256k1_modinv32_normalize_30_cold_4();
LAB_00157751:
    pcStack_c0 = (code *)0x157756;
    secp256k1_modinv32_normalize_30_cold_3();
LAB_00157756:
    pcStack_c0 = (code *)0x15775b;
    secp256k1_modinv32_normalize_30_cold_2();
  }
  else {
    psVar61 = (secp256k1_fe *)0x9;
    pcStack_c0 = (code *)0x15749e;
    psVar44 = a_01;
    iVar37 = secp256k1_modinv32_mul_cmp_30(a_01,9,psStack_a0,1);
    if (-1 < iVar37) goto LAB_0015774c;
    uVar38 = iStack_84 >> 0x1f;
    uStack_88 = psStack_a0->v[1];
    uVar39 = (uVar38 & uStack_88) + uStack_b0;
    uStack_b0 = psStack_a0->v[2];
    uVar46 = (uVar38 & uStack_b0) + uStack_ac;
    uStack_ac = psStack_a0->v[3];
    uStack_8c = psStack_a0->v[4];
    uStack_90 = psStack_a0->v[5];
    uStack_94 = psStack_a0->v[6];
    uVar83 = (uVar38 & uStack_94) + uStack_a8;
    uStack_a8 = psStack_a0->v[7];
    uStack_b4 = (int)uStack_a4 >> 0x1f;
    uStack_a4 = psStack_a0->v[8];
    uVar70 = ((uVar38 & psStack_a0->v[0]) + uVar59 ^ uStack_b4) - uStack_b4;
    uVar67 = ((int)uVar70 >> 0x1e) + ((uVar39 ^ uStack_b4) - uStack_b4);
    uVar39 = ((int)uVar67 >> 0x1e) + ((uVar46 ^ uStack_b4) - uStack_b4);
    uVar85 = ((int)uVar39 >> 0x1e) + (((uVar38 & uStack_ac) + uVar47 ^ uStack_b4) - uStack_b4);
    uVar47 = ((int)uVar85 >> 0x1e) + (((uVar38 & uStack_8c) + uVar60 ^ uStack_b4) - uStack_b4);
    uVar59 = ((int)uVar47 >> 0x1e) + (((uVar38 & uStack_90) + uVar58 ^ uStack_b4) - uStack_b4);
    uVar60 = ((int)uVar59 >> 0x1e) + ((uVar83 ^ uStack_b4) - uStack_b4);
    uVar58 = ((int)uVar60 >> 0x1e) + (((uVar38 & uStack_a8) + uVar66 ^ uStack_b4) - uStack_b4);
    uVar80 = ((int)uVar58 >> 0x1e) + (((uVar38 & uStack_a4) + iStack_84 ^ uStack_b4) - uStack_b4);
    uVar57 = (ulong)uVar80;
    uStack_b8 = (int)uVar80 >> 0x1f;
    uVar83 = (psStack_a0->v[0] & uStack_b8) + (uVar70 & 0x3fffffff);
    uVar46 = (uStack_90 & uStack_b8) + (uVar59 & 0x3fffffff);
    uVar62 = (ulong)uVar46;
    uVar70 = (uStack_94 & uStack_b8) + (uVar60 & 0x3fffffff);
    uVar50 = (ulong)uVar70;
    uVar59 = ((int)uVar83 >> 0x1e) + (uStack_88 & uStack_b8) + (uVar67 & 0x3fffffff);
    uVar60 = ((int)uVar59 >> 0x1e) + (uStack_b0 & uStack_b8) + (uVar39 & 0x3fffffff);
    uVar66 = ((int)uVar60 >> 0x1e) + (uStack_ac & uStack_b8) + (uVar85 & 0x3fffffff);
    uVar38 = ((int)uVar66 >> 0x1e) + (uStack_8c & uStack_b8) + (uVar47 & 0x3fffffff);
    uVar46 = ((int)uVar38 >> 0x1e) + uVar46;
    uVar70 = ((int)uVar46 >> 0x1e) + uVar70;
    uVar47 = ((int)uVar70 >> 0x1e) + (uStack_a8 & uStack_b8) + (uVar58 & 0x3fffffff);
    uVar58 = ((int)uVar47 >> 0x1e) + (uStack_a4 & uStack_b8) + uVar80;
    uVar43 = (ulong)uVar58;
    uVar66 = uVar66 & 0x3fffffff;
    psVar61 = (secp256k1_fe *)(ulong)uVar66;
    uVar38 = uVar38 & 0x3fffffff;
    psVar44 = (secp256k1_modinv32_signed30 *)(ulong)uVar38;
    uVar47 = uVar47 & 0x3fffffff;
    uVar42 = (ulong)uVar47;
    a_01->v[0] = uVar83 & 0x3fffffff;
    a_01->v[1] = uVar59 & 0x3fffffff;
    a_01->v[2] = uVar60 & 0x3fffffff;
    a_01->v[3] = uVar66;
    a_01->v[4] = uVar38;
    a_01->v[5] = uVar46 & 0x3fffffff;
    a_01->v[6] = uVar70 & 0x3fffffff;
    a_01->v[7] = uVar47;
    a_01->v[8] = uVar58;
    if (0x3fffffff < uVar58) goto LAB_00157751;
    psVar61 = (secp256k1_fe *)0x9;
    pcStack_c0 = (code *)0x15770f;
    psVar44 = a_01;
    iVar37 = secp256k1_modinv32_mul_cmp_30(a_01,9,psStack_a0,0);
    if (iVar37 < 0) goto LAB_00157756;
    psVar61 = (secp256k1_fe *)0x9;
    pcStack_c0 = (code *)0x15772a;
    psVar44 = a_01;
    iVar37 = secp256k1_modinv32_mul_cmp_30(a_01,9,psStack_a0,1);
    if (iVar37 < 0) {
      return;
    }
  }
  pcStack_c0 = test_inverse_field;
  secp256k1_modinv32_normalize_30_cold_1();
  a_00 = &sStack_180;
  psVar56 = &sStack_180;
  pcVar82 = secp256k1_fe_inv_var;
  if (extraout_EDX == 0) {
    pcVar82 = secp256k1_fe_inv;
  }
  pcStack_188 = (code *)0x157791;
  uStack_e8 = uVar42;
  uStack_e0 = uVar57;
  uStack_d8 = uVar50;
  psStack_d0 = a_01;
  uStack_c8 = uVar62;
  pcStack_c0 = (code *)uVar43;
  (*pcVar82)(&sStack_180);
  if (psVar44 != (secp256k1_modinv32_signed30 *)0x0) {
    *(uint64_t *)(psVar44->v + 8) = sStack_180.n[4];
    *(ulong *)(psVar44[1].v + 1) = CONCAT44(sStack_180.normalized,sStack_180.magnitude);
    *(uint64_t *)(psVar44->v + 4) = sStack_180.n[2];
    *(uint64_t *)(psVar44->v + 6) = sStack_180.n[3];
    *(uint64_t *)psVar44->v = sStack_180.n[0];
    *(uint64_t *)(psVar44->v + 2) = sStack_180.n[1];
  }
  uVar57 = 0xffffffffffff;
  sStack_120.n[0] = psVar61->n[0];
  sStack_120.n[1] = psVar61->n[1];
  sStack_120.n[2] = psVar61->n[2];
  sStack_120.n[3] = psVar61->n[3];
  sStack_120.n[4] = psVar61->n[4];
  sStack_120.magnitude = psVar61->magnitude;
  sStack_120.normalized = psVar61->normalized;
  psVar63 = &sStack_120;
  pcStack_188 = (code *)0x1577fa;
  secp256k1_fe_verify(psVar63);
  uVar42 = 0x1000003d1;
  uVar43 = (sStack_120.n[4] >> 0x30) * 0x1000003d1 + sStack_120.n[0];
  if (((uVar43 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar43 & 0xfffffffffffff) == 0)) {
    uVar50 = (uVar43 >> 0x34) + sStack_120.n[1];
    uVar62 = (uVar50 >> 0x34) + sStack_120.n[2];
    uVar65 = (uVar62 >> 0x34) + sStack_120.n[3];
    uVar68 = (uVar65 >> 0x34) + (sStack_120.n[4] & 0xffffffffffff);
    if ((((uVar50 | uVar43 | uVar62 | uVar65) & 0xfffffffffffff) != 0 || uVar68 != 0) &&
       (((uVar43 | 0x1000003d0) & uVar50 & uVar62 & uVar65 & (uVar68 ^ 0xf000000000000)) !=
        0xfffffffffffff)) goto LAB_001578a1;
LAB_00157c6b:
    pcStack_188 = (code *)0x157c76;
    secp256k1_fe_verify(&sStack_180);
    uVar57 = sStack_180.n[4] & 0xffffffffffff;
    uVar43 = (sStack_180.n[4] >> 0x30) * 0x1000003d1 + sStack_180.n[0];
    uVar50 = (uVar43 >> 0x34) + sStack_180.n[1];
    uVar62 = (uVar50 >> 0x34) + sStack_180.n[2];
    a_00 = (secp256k1_fe *)((uVar62 >> 0x34) + sStack_180.n[3]);
    uVar65 = ((ulong)a_00 >> 0x34) + uVar57;
    if ((((uVar50 | uVar43 | uVar62 | (ulong)a_00) & 0xfffffffffffff) == 0 && uVar65 == 0) ||
       (r_00 = (secp256k1_fe *)(uVar65 ^ 0xf000000000000), psVar56 = &sStack_180,
       ((uVar43 ^ 0x1000003d0) & uVar50 & uVar62 & (ulong)a_00 & (ulong)r_00) == 0xfffffffffffff)) {
      return;
    }
  }
  else {
LAB_001578a1:
    pcStack_188 = (code *)0x1578b4;
    psVar63 = psVar61;
    secp256k1_fe_mul(&sStack_120,psVar61,&sStack_180);
    pcStack_188 = (code *)0x1578bc;
    secp256k1_fe_verify(&sStack_120);
    r_00 = &fe_minus_one;
    pcStack_188 = (code *)0x1578c8;
    secp256k1_fe_verify(&fe_minus_one);
    if (sStack_120.magnitude < 0x20) {
      sStack_120.n[0] = sStack_120.n[0] + 0xffffefffffc2e;
      sStack_120.n[1] = sStack_120.n[1] + 0xfffffffffffff;
      sStack_120.n[2] = sStack_120.n[2] + 0xfffffffffffff;
      sStack_120.n[3] = sStack_120.n[3] + 0xfffffffffffff;
      sStack_120.n[4] = sStack_120.n[4] + 0xffffffffffff;
      sStack_120.normalized = 0;
      sStack_120.magnitude = sStack_120.magnitude + 1;
      pcStack_188 = (code *)0x15791a;
      secp256k1_fe_verify(&sStack_120);
      pcStack_188 = (code *)0x157922;
      secp256k1_fe_verify(&sStack_120);
      uVar43 = (sStack_120.n[4] >> 0x30) * 0x1000003d1 + sStack_120.n[0];
      uVar50 = (uVar43 >> 0x34) + sStack_120.n[1];
      uVar62 = (uVar50 >> 0x34) + sStack_120.n[2];
      psVar63 = (secp256k1_fe *)((uVar62 >> 0x34) + sStack_120.n[3]);
      uVar65 = ((ulong)psVar63 >> 0x34) + (sStack_120.n[4] & 0xffffffffffff);
      if ((((uVar50 | uVar43 | uVar62 | (ulong)psVar63) & 0xfffffffffffff) != 0 || uVar65 != 0) &&
         (r_00 = (secp256k1_fe *)(uVar65 ^ 0xf000000000000),
         ((uVar43 ^ 0x1000003d0) & uVar50 & uVar62 & (ulong)psVar63 & (ulong)r_00) !=
         0xfffffffffffff)) goto LAB_00157d09;
      sStack_150.n[0] = psVar61->n[0];
      sStack_150.n[1] = psVar61->n[1];
      sStack_150.n[2] = psVar61->n[2];
      sStack_150.n[3] = psVar61->n[3];
      sStack_150.n[4] = psVar61->n[4];
      sStack_150.magnitude = psVar61->magnitude;
      sStack_150.normalized = psVar61->normalized;
      psVar61 = &sStack_150;
      pcStack_188 = (code *)0x1579c8;
      secp256k1_fe_verify(psVar61);
      r_00 = &fe_minus_one;
      pcStack_188 = (code *)0x1579d4;
      secp256k1_fe_verify(&fe_minus_one);
      if (0x1f < sStack_150.magnitude) goto LAB_00157d0e;
      sStack_150.n[0] = sStack_150.n[0] + 0xffffefffffc2e;
      sStack_150.n[1] = sStack_150.n[1] + 0xfffffffffffff;
      sStack_150.n[2] = sStack_150.n[2] + 0xfffffffffffff;
      sStack_150.n[3] = sStack_150.n[3] + 0xfffffffffffff;
      sStack_150.n[4] = sStack_150.n[4] + 0xffffffffffff;
      sStack_150.normalized = 0;
      sStack_150.magnitude = sStack_150.magnitude + 1;
      pcStack_188 = (code *)0x157a1f;
      secp256k1_fe_verify(&sStack_150);
      pcStack_188 = (code *)0x157a27;
      secp256k1_fe_verify(&sStack_150);
      uVar43 = (sStack_150.n[4] >> 0x30) * 0x1000003d1 + sStack_150.n[0];
      if (((uVar43 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar43 & 0xfffffffffffff) == 0)) {
        uVar50 = (uVar43 >> 0x34) + sStack_150.n[1];
        uVar62 = (uVar50 >> 0x34) + sStack_150.n[2];
        uVar65 = (uVar62 >> 0x34) + sStack_150.n[3];
        uVar68 = (uVar65 >> 0x34) + (sStack_150.n[4] & 0xffffffffffff);
        if (((uVar50 | uVar43 | uVar62 | uVar65) & 0xfffffffffffff) == 0 && uVar68 == 0) {
          return;
        }
        if (((uVar43 | 0x1000003d0) & uVar50 & uVar62 & uVar65 & (uVar68 ^ 0xf000000000000)) ==
            0xfffffffffffff) {
          return;
        }
      }
      psVar63 = &sStack_150;
      pcStack_188 = (code *)0x157ad6;
      (*pcVar82)();
      pcStack_188 = (code *)0x157ae1;
      secp256k1_fe_verify(&sStack_180);
      r_00 = &fe_minus_one;
      pcStack_188 = (code *)0x157aed;
      secp256k1_fe_verify(&fe_minus_one);
      psVar61 = &sStack_180;
      if (0x1f < sStack_180.magnitude) goto LAB_00157d13;
      sStack_180.n[0] = sStack_180.n[0] + 0xffffefffffc2e;
      sStack_180.n[1] = sStack_180.n[1] + 0xfffffffffffff;
      sStack_180.n[2] = sStack_180.n[2] + 0xfffffffffffff;
      sStack_180.n[3] = sStack_180.n[3] + 0xfffffffffffff;
      sStack_180.n[4] = sStack_180.n[4] + 0xffffffffffff;
      sStack_180.magnitude = sStack_180.magnitude + 1;
      sStack_180.normalized = 0;
      pcStack_188 = (code *)0x157b36;
      secp256k1_fe_verify(&sStack_180);
      pcStack_188 = (code *)0x157b3f;
      (*pcVar82)(&sStack_180);
      pcStack_188 = (code *)0x157b47;
      secp256k1_fe_verify(&sStack_180);
      sStack_180.n[0] = sStack_180.n[0] + 1;
      sStack_180.magnitude = sStack_180.magnitude + 1;
      sStack_180.normalized = 0;
      pcStack_188 = (code *)0x157b59;
      secp256k1_fe_verify(&sStack_180);
      pcStack_188 = (code *)0x157b61;
      secp256k1_fe_verify(&sStack_180);
      psVar63 = &sStack_150;
      pcStack_188 = (code *)0x157b6e;
      r_00 = psVar63;
      secp256k1_fe_verify(psVar63);
      if (sStack_150.magnitude + sStack_180.magnitude < 0x21) {
        sStack_180.n[0] = sStack_180.n[0] + sStack_150.n[0];
        sStack_180.n[1] = sStack_180.n[1] + sStack_150.n[1];
        sStack_180.n[2] = sStack_180.n[2] + sStack_150.n[2];
        sStack_180.n[3] = sStack_180.n[3] + sStack_150.n[3];
        sStack_180.n[4] = sStack_180.n[4] + sStack_150.n[4];
        sStack_180.normalized = 0;
        pcStack_188 = (code *)0x157bba;
        sStack_180.magnitude = sStack_150.magnitude + sStack_180.magnitude;
        secp256k1_fe_verify(&sStack_180);
        pcStack_188 = (code *)0x157bc2;
        secp256k1_fe_verify(&sStack_180);
        uVar43 = (sStack_180.n[4] >> 0x30) * 0x1000003d1 + sStack_180.n[0];
        if (((uVar43 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar43 & 0xfffffffffffff) == 0)) {
          uVar57 = (uVar43 >> 0x34) + sStack_180.n[1];
          uVar50 = (uVar57 >> 0x34) + sStack_180.n[2];
          uVar62 = (uVar50 >> 0x34) + sStack_180.n[3];
          uVar65 = (uVar62 >> 0x34) + (sStack_180.n[4] & 0xffffffffffff);
          if (((uVar57 | uVar43 | uVar50 | uVar62) & 0xfffffffffffff) == 0 && uVar65 == 0) {
            return;
          }
          if (((uVar43 | 0x1000003d0) & uVar57 & uVar50 & uVar62 & (uVar65 ^ 0xf000000000000)) ==
              0xfffffffffffff) {
            return;
          }
        }
        pcStack_188 = (code *)0x157c6b;
        test_inverse_field_cold_2();
        goto LAB_00157c6b;
      }
    }
    else {
      pcStack_188 = (code *)0x157d09;
      test_inverse_field_cold_7();
LAB_00157d09:
      pcStack_188 = (code *)0x157d0e;
      test_inverse_field_cold_6();
LAB_00157d0e:
      pcStack_188 = (code *)0x157d13;
      test_inverse_field_cold_5();
LAB_00157d13:
      a_00 = psVar63;
      psVar56 = psVar61;
      psVar63 = &sStack_120;
      pcStack_188 = (code *)0x157d18;
      test_inverse_field_cold_4();
    }
    pcStack_188 = (code *)0x157d1d;
    test_inverse_field_cold_3();
  }
  pcStack_188 = test_inverse_scalar;
  test_inverse_field_cold_1();
  uStack_190 = 0xfffffffffffff;
  uStack_1a0 = 0x1000003d1;
  pcVar86 = secp256k1_scalar_inverse_var;
  if (extraout_EDX_00 == 0) {
    pcVar86 = secp256k1_scalar_inverse;
  }
  psVar61 = (secp256k1_fe *)auStack_238;
  psStack_250 = (secp256k1_fe *)0x157d58;
  r_01 = psVar61;
  auStack_1d0._32_8_ = psVar56;
  auStack_1d0._40_8_ = pcVar82;
  psStack_198 = psVar63;
  pcStack_188 = (code *)uVar57;
  uVar40 = (*pcVar86)();
  if (r_00 != (secp256k1_fe *)0x0) {
    r_00->n[2] = CONCAT44(auStack_238._20_4_,auStack_238._16_4_);
    r_00->n[3] = CONCAT44(auStack_238._28_4_,auStack_238._24_4_);
    r_00->n[0] = CONCAT44(auStack_238._4_4_,auStack_238._0_4_);
    r_00->n[1] = CONCAT44(auStack_238._12_4_,auStack_238._8_4_);
  }
  uVar47 = 0;
  uVar60 = 0;
  uVar58 = 0;
  uVar66 = 0;
  auVar89._0_4_ = -(uint)((int)a_00->n[2] == 0 && (int)a_00->n[0] == 0);
  auVar89._4_4_ = -(uint)(*(int *)((long)a_00->n + 0x14) == 0 && *(int *)((long)a_00->n + 4) == 0);
  auVar89._8_4_ = -(uint)((int)a_00->n[3] == 0 && (int)a_00->n[1] == 0);
  auVar89._12_4_ =
       -(uint)(*(int *)((long)a_00->n + 0x1c) == 0 && *(int *)((long)a_00->n + 0xc) == 0);
  uVar59 = movmskps(uVar40,auVar89);
  uVar59 = uVar59 ^ 0xf;
  if (uVar59 != 0) {
    uVar43 = a_00->n[0];
    uVar57 = a_00->n[1];
    uVar50 = a_00->n[2];
    uVar55 = CONCAT44(auStack_238._4_4_,auStack_238._0_4_);
    pcVar82 = (code *)CONCAT44(auStack_238._12_4_,auStack_238._8_4_);
    uVar42 = CONCAT44(auStack_238._20_4_,auStack_238._16_4_);
    r_00 = (secp256k1_fe *)CONCAT44(auStack_238._28_4_,auStack_238._24_4_);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar43;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar55;
    uVar51 = SUB168(auVar2 * auVar18,8);
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar51;
    sStack_218.n[0] = SUB168(auVar2 * auVar18,0);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar43;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = pcVar82;
    auVar3 = auVar3 * auVar19;
    uVar69 = SUB168(auVar3 + auVar36,0);
    uVar72 = SUB168(auVar3 + auVar36,8);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar57;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uVar55;
    uVar52 = SUB168(auVar4 * auVar20,8);
    uVar68 = SUB168(auVar4 * auVar20,0);
    uVar62 = (ulong)CARRY8(uVar69,uVar68);
    uVar65 = uVar72 + uVar52;
    uVar73 = uVar65 + uVar62;
    uVar75 = (ulong)CARRY8(auVar3._8_8_,(ulong)CARRY8(uVar51,auVar3._0_8_)) +
             (ulong)(CARRY8(uVar72,uVar52) || CARRY8(uVar65,uVar62));
    sStack_218.n[1] = uVar69 + uVar68;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar43;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uVar42;
    uVar53 = SUB168(auVar5 * auVar21,8);
    uVar62 = SUB168(auVar5 * auVar21,0);
    uVar68 = uVar73 + uVar62;
    uVar62 = (ulong)CARRY8(uVar73,uVar62);
    uVar51 = uVar75 + uVar53;
    uVar76 = uVar51 + uVar62;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar57;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = pcVar82;
    uVar73 = SUB168(auVar6 * auVar22,8);
    uVar65 = SUB168(auVar6 * auVar22,0);
    uVar74 = uVar68 + uVar65;
    uVar65 = (ulong)CARRY8(uVar68,uVar65);
    uVar52 = uVar76 + uVar73;
    uVar77 = uVar52 + uVar65;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar50;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = uVar55;
    uVar54 = SUB168(auVar7 * auVar23,8);
    uVar72 = SUB168(auVar7 * auVar23,0);
    uVar68 = (ulong)CARRY8(uVar74,uVar72);
    uVar69 = uVar77 + uVar54;
    uVar78 = uVar69 + uVar68;
    uVar75 = (ulong)(CARRY8(uVar75,uVar53) || CARRY8(uVar51,uVar62)) +
             (ulong)(CARRY8(uVar76,uVar73) || CARRY8(uVar52,uVar65)) +
             (ulong)(CARRY8(uVar77,uVar54) || CARRY8(uVar69,uVar68));
    sStack_218.n[2] = uVar74 + uVar72;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar43;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = r_00;
    uVar72 = SUB168(auVar8 * auVar24,8);
    uVar43 = SUB168(auVar8 * auVar24,0);
    uVar65 = uVar78 + uVar43;
    uVar43 = (ulong)CARRY8(uVar78,uVar43);
    uVar51 = uVar75 + uVar72;
    uVar74 = uVar51 + uVar43;
    pcVar87 = (code *)a_00->n[3];
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar57;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar42;
    uVar53 = SUB168(auVar9 * auVar25,8);
    uVar62 = SUB168(auVar9 * auVar25,0);
    uVar68 = uVar65 + uVar62;
    uVar62 = (ulong)CARRY8(uVar65,uVar62);
    uVar52 = uVar74 + uVar53;
    uVar76 = uVar52 + uVar62;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar50;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = pcVar82;
    uVar73 = SUB168(auVar10 * auVar26,8);
    uVar65 = SUB168(auVar10 * auVar26,0);
    uVar78 = uVar68 + uVar65;
    uVar65 = (ulong)CARRY8(uVar68,uVar65);
    uVar69 = uVar76 + uVar73;
    uVar77 = uVar69 + uVar65;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = pcVar87;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar55;
    uVar54 = SUB168(auVar11 * auVar27,8);
    uVar68 = SUB168(auVar11 * auVar27,0);
    sStack_218.n[3] = uVar78 + uVar68;
    uVar68 = (ulong)CARRY8(uVar78,uVar68);
    uVar55 = uVar77 + uVar54;
    uVar78 = uVar55 + uVar68;
    uVar72 = (ulong)(CARRY8(uVar75,uVar72) || CARRY8(uVar51,uVar43)) +
             (ulong)(CARRY8(uVar74,uVar53) || CARRY8(uVar52,uVar62)) +
             (ulong)(CARRY8(uVar76,uVar73) || CARRY8(uVar69,uVar65)) +
             (ulong)(CARRY8(uVar77,uVar54) || CARRY8(uVar55,uVar68));
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar57;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = r_00;
    uVar52 = SUB168(auVar12 * auVar28,8);
    uVar43 = SUB168(auVar12 * auVar28,0);
    uVar62 = uVar78 + uVar43;
    uVar43 = (ulong)CARRY8(uVar78,uVar43);
    uVar65 = uVar72 + uVar52;
    uVar53 = uVar65 + uVar43;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar50;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar42;
    uVar69 = SUB168(auVar13 * auVar29,8);
    uVar57 = SUB168(auVar13 * auVar29,0);
    uVar51 = uVar62 + uVar57;
    uVar57 = (ulong)CARRY8(uVar62,uVar57);
    uVar68 = uVar53 + uVar69;
    uVar73 = uVar68 + uVar57;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = pcVar87;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = pcVar82;
    uVar55 = SUB168(auVar14 * auVar30,8);
    uVar62 = SUB168(auVar14 * auVar30,0);
    sStack_218.n[4] = uVar51 + uVar62;
    uVar62 = (ulong)CARRY8(uVar51,uVar62);
    uVar51 = uVar73 + uVar55;
    uVar54 = uVar51 + uVar62;
    uVar51 = (ulong)(CARRY8(uVar72,uVar52) || CARRY8(uVar65,uVar43)) +
             (ulong)(CARRY8(uVar53,uVar69) || CARRY8(uVar68,uVar57)) +
             (ulong)(CARRY8(uVar73,uVar55) || CARRY8(uVar51,uVar62));
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uVar50;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = r_00;
    uVar65 = SUB168(auVar15 * auVar31,8);
    uVar43 = SUB168(auVar15 * auVar31,0);
    uVar62 = uVar54 + uVar43;
    uVar43 = (ulong)CARRY8(uVar54,uVar43);
    uVar50 = uVar51 + uVar65;
    uVar52 = uVar50 + uVar43;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = pcVar87;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = uVar42;
    uVar68 = SUB168(auVar16 * auVar32,8);
    uVar57 = SUB168(auVar16 * auVar32,0);
    sStack_218._40_8_ = uVar62 + uVar57;
    uVar57 = (ulong)CARRY8(uVar62,uVar57);
    uVar62 = uVar52 + uVar68;
    auStack_1e8._8_8_ =
         (ulong)(CARRY8(uVar51,uVar65) || CARRY8(uVar50,uVar43)) +
         (ulong)(CARRY8(uVar52,uVar68) || CARRY8(uVar62,uVar57));
    auStack_1e8._0_8_ = uVar62 + uVar57;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = pcVar87;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = r_00;
    auStack_1e8 = auVar17 * auVar33 + auStack_1e8;
    psVar61 = (secp256k1_fe *)auStack_1d0;
    psStack_250 = (secp256k1_fe *)0x157ef3;
    r_01 = psVar61;
    pcStack_240 = pcVar86;
    secp256k1_scalar_reduce_512((secp256k1_scalar *)psVar61,(uint64_t *)(auStack_238 + 0x20));
    if (((auStack_1d0._0_8_ != 1 || auStack_1d0._8_8_ != 0) || auStack_1d0._16_8_ != 0) ||
        auStack_1d0._24_8_ != 0) {
      psStack_250 = (secp256k1_fe *)0x157fea;
      test_inverse_scalar_cold_1();
      goto LAB_00157fea;
    }
    psStack_250 = (secp256k1_fe *)0x157f23;
    iVar37 = secp256k1_scalar_add
                       ((secp256k1_scalar *)(auStack_238 + 0x20),(secp256k1_scalar *)a_00,
                        &scalar_minus_one);
    pcVar86 = pcStack_240;
    auVar88._0_4_ = -(uint)((int)sStack_218.n[2] == 0 && (int)sStack_218.n[0] == 0);
    auVar88._4_4_ = -(uint)(sStack_218.n[2]._4_4_ == 0 && sStack_218.n[0]._4_4_ == 0);
    auVar88._8_4_ = -(uint)((int)sStack_218.n[3] == 0 && (int)sStack_218.n[1] == 0);
    auVar88._12_4_ = -(uint)(sStack_218.n[3]._4_4_ == 0 && sStack_218.n[1]._4_4_ == 0);
    iVar37 = movmskps(iVar37,auVar88);
    if (iVar37 == 0xf) {
      return;
    }
    psVar61 = (secp256k1_fe *)(auStack_238 + 0x20);
    psStack_250 = (secp256k1_fe *)0x157f53;
    (*pcStack_240)(psVar61,psVar61);
    r_00 = (secp256k1_fe *)auStack_238;
    psStack_250 = (secp256k1_fe *)0x157f6a;
    secp256k1_scalar_add((secp256k1_scalar *)r_00,&scalar_minus_one,(secp256k1_scalar *)r_00);
    psStack_250 = (secp256k1_fe *)0x157f73;
    (*pcVar86)(r_00,r_00);
    psStack_250 = (secp256k1_fe *)0x157f85;
    secp256k1_scalar_add((secp256k1_scalar *)r_00,(secp256k1_scalar *)r_00,&secp256k1_scalar_one);
    psStack_250 = (secp256k1_fe *)0x157f93;
    r_01 = r_00;
    iVar37 = secp256k1_scalar_add
                       ((secp256k1_scalar *)r_00,(secp256k1_scalar *)psVar61,
                        (secp256k1_scalar *)r_00);
    auVar90._0_4_ = -(uint)(auStack_238._16_4_ == 0 && auStack_238._0_4_ == 0);
    auVar90._4_4_ = -(uint)(auStack_238._20_4_ == 0 && auStack_238._4_4_ == 0);
    auVar90._8_4_ = -(uint)(auStack_238._24_4_ == 0 && auStack_238._8_4_ == 0);
    auVar90._12_4_ = -(uint)(auStack_238._28_4_ == 0 && auStack_238._12_4_ == 0);
    iVar37 = movmskps(iVar37,auVar90);
    if (iVar37 == 0xf) {
      return;
    }
    psStack_250 = (secp256k1_fe *)0x157fb7;
    test_inverse_scalar_cold_2();
    uVar59 = extraout_EAX;
    uVar47 = extraout_XMM0_Da;
    uVar60 = extraout_XMM0_Db;
    uVar58 = extraout_XMM0_Dc;
    uVar66 = extraout_XMM0_Dd;
  }
  auVar91._0_4_ = -(uint)((auStack_238._16_4_ | auStack_238._0_4_) == uVar47);
  auVar91._4_4_ = -(uint)((auStack_238._20_4_ | auStack_238._4_4_) == uVar60);
  auVar91._8_4_ = -(uint)((auStack_238._24_4_ | auStack_238._8_4_) == uVar58);
  auVar91._12_4_ = -(uint)((auStack_238._28_4_ | auStack_238._12_4_) == uVar66);
  iVar37 = movmskps(uVar59,auVar91);
  pcVar87 = pcVar86;
  if (iVar37 == 0xf) {
    return;
  }
LAB_00157fea:
  psStack_250 = (secp256k1_fe *)random_fe;
  test_inverse_scalar_cold_3();
  psStack_278 = psVar61;
  pcStack_270 = pcVar82;
  uStack_268 = uVar42;
  psStack_260 = r_00;
  pcStack_258 = pcVar87;
  psStack_250 = a_00;
  do {
    secp256k1_testrand256(auStack_2a0);
    secp256k1_fe_impl_set_b32_mod(r_01,auStack_2a0);
    bVar34 = (r_01->n[2] & r_01->n[3] & r_01->n[1]) == 0xfffffffffffff;
    bVar35 = r_01->n[4] == 0xffffffffffff;
    bVar1 = 0xffffefffffc2e < r_01->n[0];
    if (bVar1 && (bVar34 && bVar35)) {
      r_01->magnitude = -1;
    }
    else {
      r_01->magnitude = 1;
      r_01->normalized = 1;
      secp256k1_fe_verify(r_01);
    }
  } while (bVar1 && (bVar34 && bVar35));
  return;
}

Assistant:

static void secp256k1_modinv32_mul_30(secp256k1_modinv32_signed30 *r, const secp256k1_modinv32_signed30 *a, int alen, int32_t factor) {
    const int32_t M30 = (int32_t)(UINT32_MAX >> 2);
    int64_t c = 0;
    int i;
    for (i = 0; i < 8; ++i) {
        if (i < alen) c += (int64_t)a->v[i] * factor;
        r->v[i] = (int32_t)c & M30; c >>= 30;
    }
    if (8 < alen) c += (int64_t)a->v[8] * factor;
    VERIFY_CHECK(c == (int32_t)c);
    r->v[8] = (int32_t)c;
}